

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  bool bVar1;
  string flagsVar;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"CMAKE_",&local_51);
  std::__cxx11::string::append((string *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  AddConfigVariableFlags(this,flags,&local_50,config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar1) {
    AppendFeatureOptions(this,flags,lang,"IPO");
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  std::string flagsVar = "CMAKE_";
  flagsVar += lang;
  flagsVar += "_FLAGS";
  this->AddConfigVariableFlags(flags, flagsVar, config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(flags, lang, "IPO");
  }
}